

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O2

void __thiscall RangeSize::RangeSize(RangeSize *this,IntVar *_x,IntVar *_y)

{
  Propagator::Propagator(&this->super_Propagator);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_001f2d78;
  this->x = _x;
  this->y = _y;
  (this->super_Propagator).priority = 1;
  (*(_x->super_Var).super_Branching._vptr_Branching[7])(_x,this,0,6);
  return;
}

Assistant:

RangeSize(IntVar* _x, IntVar* _y) : x(_x), y(_y) {
		priority = 1;
		x->attach(this, 0, EVENT_LU);
	}